

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes.c
# Opt level: O2

void nes_defchr(int *ip)

{
  char last_char;
  int iVar1;
  long lVar2;
  uint data [8];
  uchar buffer [16];
  
  labldef(loccnt,1);
  data_loccnt = loccnt;
  data_size = 3;
  lVar2 = 0;
  data_level = data_size;
  while( true ) {
    if (lVar2 == 8) {
      nes_pack_8x8_tile(buffer,data,0,2);
      putbuffer(buffer,0x10);
      if (pass == 1) {
        println();
      }
      return;
    }
    last_char = ',';
    if (lVar2 == 7) {
      last_char = ';';
    }
    iVar1 = evaluate(ip,last_char);
    if (iVar1 == 0) break;
    data[lVar2] = value;
    lVar2 = lVar2 + 1;
  }
  return;
}

Assistant:

void
nes_defchr(int *ip)
{
	unsigned char buffer[16];
	unsigned int data[8];
	int size;
	int i;

	/* define label */
	labldef(loccnt, 1);

	/* output infos */
	data_loccnt = loccnt;
	data_size   = 3;
	data_level  = 3;

	/* get tile data */
	for (i = 0; i < 8; i++) {
		/* get value */
		if (!evaluate(ip, (i < 7) ? ',' : ';'))
			return;

		/* store value */
		data[i] = value;
	}

	/* encode tile */
	size = nes_pack_8x8_tile(buffer, data, 0, PACKED_TILE);

	/* store tile */
	putbuffer(buffer, size);

	/* output line */
	if (pass == LAST_PASS)
		println();
}